

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_choices_validation_longlong(void)

{
  longlong ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *local_c8;
  char *args_4 [3];
  char *local_a8;
  char *args_3 [3];
  char *local_88;
  char *args_2 [3];
  char *local_68;
  char *args_1 [3];
  char *local_48;
  char *args [3];
  longlong a;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&a,0,"program");
  if (iVar1 == 0) {
    cargo._4_4_ = cargo_add_option((cargo_t)a,0,"--alpha -a",(char *)0x0,"L",args + 2);
    ctx = a;
    if (cargo._4_4_ == 0) {
      vd = cargo_validate_choices
                     (CARGO_VALIDATE_CHOICES_NONE,CARGO_LONGLONG,3,0xffffffffffef0bb9,0x1ed36a0,
                      0xf69b5);
      cargo._4_4_ = cargo_add_validation((cargo_t)ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (cargo._4_4_ == 0) {
        local_48 = "program";
        args[0] = "--alpha";
        args[1] = "5";
        cargo._4_4_ = cargo_parse((cargo_t)a,0,1,3,&local_48);
        if (cargo._4_4_ < 0) {
          local_68 = "program";
          args_1[0] = "--alpha";
          args_1[1] = "-1111111";
          cargo._4_4_ = cargo_parse((cargo_t)a,0,1,3,&local_68);
          if (cargo._4_4_ == 0) {
            local_88 = "program";
            args_2[0] = "--alpha";
            args_2[1] = "32323232";
            cargo._4_4_ = cargo_parse((cargo_t)a,0,1,3,&local_88);
            if (cargo._4_4_ == 0) {
              local_a8 = "program";
              args_3[0] = "--alpha";
              args_3[1] = "1010101";
              cargo._4_4_ = cargo_parse((cargo_t)a,0,1,3,&local_a8);
              if (cargo._4_4_ == 0) {
                local_c8 = "program";
                args_4[0] = "--alpha";
                args_4[1] = "4224422";
                cargo._4_4_ = cargo_parse((cargo_t)a,0,1,3,&local_c8);
                if (-1 < cargo._4_4_) {
                  pcStack_18 = "Expected parse failure for 4224422";
                }
              }
              else {
                pcStack_18 = "Failed to parse";
              }
            }
            else {
              pcStack_18 = "Failed to parse";
            }
          }
          else {
            pcStack_18 = "Failed to parse";
          }
        }
        else {
          pcStack_18 = "Expected parse failure for 5";
        }
      }
      else {
        pcStack_18 = "Failed to add validation";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    cargo_destroy((cargo_t *)&a);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_choices_validation_longlong)
{
    long long int a;

    _CARGO_ADD_TEST_VALIDATE("L", &a,
            cargo_validate_choices, 0, CARGO_LONGLONG,
            3,
            (long long int)-1111111,
            (long long int)32323232,
            (long long int)1010101);
    _CARGO_TEST_VALIDATE_VALUE(5, 1);
    _CARGO_TEST_VALIDATE_VALUE(-1111111, 0);
    _CARGO_TEST_VALIDATE_VALUE(32323232, 0);
    _CARGO_TEST_VALIDATE_VALUE(1010101, 0);
    _CARGO_TEST_VALIDATE_VALUE(4224422, 1);
    _TEST_CLEANUP();
}